

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigInd.c
# Opt level: O2

int Saig_ManInduction(Aig_Man_t *p,int nTimeOut,int nFramesMax,int nConfMax,int fUnique,
                     int fUniqueAll,int fGetCex,int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  Vec_Int_t *p_00;
  Vec_Ptr_t *vPos;
  int iVar2;
  uint i;
  int iVar3;
  int iVar4;
  int v;
  abctime aVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *pAVar7;
  Vec_Int_t *pVVar8;
  sat_solver *s;
  Cnf_Dat_t *pCVar9;
  void *pvVar10;
  void *Entry;
  Abc_Cex_t *pAVar11;
  undefined4 in_register_00000014;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  lit *begin;
  lit *begin_00;
  ulong uVar16;
  Aig_Man_t *pAVar17;
  char *__format;
  long lVar18;
  long lVar19;
  bool bVar20;
  uint local_f0;
  uint local_e0;
  int nSatVarNum;
  int Lits [2];
  ulong local_d0;
  Vec_Int_t *local_c8;
  void *local_c0;
  Cnf_Dat_t *local_b8;
  Vec_Int_t *local_b0;
  uint local_a8;
  int local_a4;
  Aig_Man_t *local_a0;
  sat_solver *local_98;
  Vec_Int_t *local_90;
  ulong local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  Vec_Ptr_t *local_70;
  Vec_Ptr_t *local_68;
  ulong local_60;
  uint local_54;
  abctime local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_60 = CONCAT44(in_register_00000014,nFramesMax);
  local_e0 = 0;
  iVar2 = nTimeOut;
  local_74 = nConfMax;
  if (nTimeOut == 0) {
    lVar18 = 0;
  }
  else {
    aVar5 = Abc_Clock();
    lVar18 = aVar5 + (long)nTimeOut * 1000000;
  }
  if (fUniqueAll != 0 && fUnique != 0) {
    __assert_fail("fUnique == 0 || fUniqueAll == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                  ,0xa0,"int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  local_7c = fUnique;
  local_78 = fUniqueAll;
  local_54 = nTimeOut;
  if (p->nTruePos != 1) {
    __assert_fail("Saig_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                  ,0xa1,"int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                 );
  }
  pAVar17 = p;
  Aig_ManSetCioIds(p);
  iVar3 = (int)pAVar17;
  local_70 = Vec_PtrAlloc(iVar3);
  pVVar6 = Vec_PtrAlloc(iVar3);
  local_b0 = Vec_IntAlloc(1000);
  pAVar7 = Aig_ManCo(p,iVar2);
  local_68 = pVVar6;
  Vec_PtrPush(pVVar6,pAVar7);
  pVVar8 = Vec_IntAlloc(100);
  s = sat_solver_new();
  sat_solver_setnvars(s,1000);
  uVar12 = local_60;
  uVar13 = local_74;
  if (lVar18 != 0) {
    s->nRuntimeLimit = lVar18;
  }
  nSatVarNum = 0;
  if (fVerbose != 0) {
    printf("Induction parameters: FramesMax = %5d. ConflictMax = %6d.\n",local_60 & 0xffffffff,
           (ulong)local_74);
  }
  local_40 = (long)(int)uVar13;
  local_a8 = (int)uVar12 - 1;
  local_a4 = 1;
  local_90 = (Vec_Int_t *)0x0;
  local_f0 = 0;
  local_d0 = 0;
  local_a0 = (Aig_Man_t *)0x0;
  pCVar9 = (Cnf_Dat_t *)0x0;
  local_c8 = pVVar8;
  local_98 = s;
  local_48 = lVar18;
  do {
    if (local_f0 != 0) {
      Aig_ManStop(local_a0);
      Cnf_DataFree(pCVar9);
    }
    local_50 = Abc_Clock();
    vPos = local_68;
    pVVar6 = local_70;
    Aig_SupportNodes(p,(Aig_Obj_t **)local_68->pArray,local_68->nSize,local_70);
    local_a0 = Aig_ManDupSimpleDfsPart(p,pVVar6,vPos);
    pCVar9 = Cnf_Derive(local_a0,local_a0->nObjs[3]);
    iVar2 = nSatVarNum;
    begin = (lit *)(ulong)(uint)nSatVarNum;
    Cnf_DataLift(pCVar9,nSatVarNum);
    nSatVarNum = iVar2 + pCVar9->nVars;
    uVar13 = local_e0 + pCVar9->nClauses;
    local_b8 = pCVar9;
    if ((fGetCex != 0) && (local_90 == (Vec_Int_t *)0x0)) {
      iVar2 = p->nObjs[2];
      local_90 = Vec_IntAlloc(iVar2);
      local_90->nSize = iVar2;
      if (local_90->pArray != (int *)0x0) {
        begin = (lit *)0xff;
        memset(local_90->pArray,0xff,(long)iVar2 << 2);
      }
      for (uVar14 = 0; s = local_98, (int)uVar14 < p->vCis->nSize; uVar14 = uVar14 + 1) {
        begin = (lit *)(ulong)uVar14;
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,uVar14);
        pvVar10 = (pAVar7->field_5).pData;
        if (pvVar10 != (void *)0x0) {
          if ((*(uint *)((long)pvVar10 + 0x18) & 7) != 2) {
            __assert_fail("Aig_ObjIsCi(pObjPiCopy)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0xd3,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          if (((*(uint *)&pAVar7->field_0x18 & 7) == 2) &&
             (iVar2 = Aig_ObjCioId(pAVar7), iVar2 < p->nTruePis)) {
            iVar2 = Aig_ObjCioId(pAVar7);
            i = iVar2 + p->nRegs;
          }
          else {
            iVar2 = Saig_ObjIsLo(p,pAVar7);
            if (iVar2 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                            ,0xd8,
                            "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                           );
            }
            iVar2 = Aig_ObjCioId(pAVar7);
            i = iVar2 - p->nTruePis;
          }
          begin = (lit *)(ulong)i;
          Vec_IntWriteEntry(local_90,i,local_b8->pVarNums[*(int *)((long)pvVar10 + 0x24)]);
        }
      }
    }
    if (local_a0->nObjs[3] + -1 != local_c8->nSize) {
      __assert_fail("Aig_ManCoNum(pAigPart)-1 == Vec_IntSize(vTopVarNums)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                    ,0xdd,
                    "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
    }
    local_38 = (ulong)(local_f0 != 0);
    uVar12 = 0;
    while( true ) {
      pCVar9 = local_b8;
      pVVar8 = local_c8;
      begin_00 = Lits;
      iVar2 = (int)uVar12;
      if (local_a0->vCos->nSize <= iVar2) break;
      pvVar10 = Vec_PtrEntry(local_a0->vCos,iVar2);
      pVVar8 = local_c8;
      if (iVar2 == 0) {
        Lits[0] = (int)local_38 + local_b8->pVarNums[*(int *)((long)pvVar10 + 0x24)] * 2;
        iVar2 = sat_solver_addclause(s,begin_00,Lits + 1);
        iVar3 = 1;
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0xe8,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
      }
      else {
        local_88 = uVar12;
        iVar3 = Vec_IntEntry(local_c8,iVar2 + -1);
        pCVar9 = local_b8;
        Lits[0] = iVar3 * 2;
        begin_00 = Lits;
        Lits[1] = local_b8->pVarNums[*(int *)((long)pvVar10 + 0x24)] * 2 + 1;
        local_c0 = pvVar10;
        iVar3 = sat_solver_addclause(s,begin_00,(lit *)&local_d0);
        if (iVar3 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0xef,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar2 = Vec_IntEntry(pVVar8,iVar2 + -1);
        Lits[0] = iVar2 * 2 + 1;
        Lits[1] = pCVar9->pVarNums[*(int *)((long)local_c0 + 0x24)] * 2;
        iVar2 = sat_solver_addclause(s,begin_00,(lit *)&local_d0);
        iVar3 = 2;
        uVar12 = local_88;
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0xf3,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
      }
      uVar13 = uVar13 + iVar3;
      uVar12 = (ulong)((int)uVar12 + 1);
      begin = begin_00;
    }
    lVar18 = 0;
    local_e0 = uVar13;
    do {
      lVar19 = lVar18;
      iVar3 = (int)begin;
      iVar2 = pCVar9->nClauses;
      if (iVar2 <= lVar19) goto LAB_00592b88;
      begin = pCVar9->pClauses[lVar19];
      iVar2 = sat_solver_addclause(s,begin,pCVar9->pClauses[lVar19 + 1]);
      iVar3 = (int)begin;
      lVar18 = lVar19 + 1;
    } while (iVar2 != 0);
    iVar2 = pCVar9->nClauses;
LAB_00592b88:
    pVVar6 = local_68;
    p_00 = local_b0;
    if ((int)lVar19 < iVar2) break;
    local_68->nSize = 0;
    pAVar7 = Aig_ManCo(p,iVar3);
    Vec_PtrPush(pVVar6,pAVar7);
    pVVar8->nSize = 0;
    iVar2 = p_00->nSize;
    local_88 = CONCAT44(local_88._4_4_,iVar2);
    local_c0 = (void *)CONCAT44(local_c0._4_4_,iVar2);
    if (0 < p->nRegs) {
      iVar15 = p->nRegs + iVar2;
      iVar3 = p_00->nCap * 2;
      iVar4 = iVar15;
      if ((iVar3 < iVar15) || (iVar4 = iVar3, p_00->nCap < iVar15)) {
        Vec_IntGrow(p_00,iVar4);
        iVar2 = p_00->nSize;
      }
      for (lVar18 = (long)iVar2; lVar18 < iVar15; lVar18 = lVar18 + 1) {
        p_00->pArray[lVar18] = -1;
      }
      p_00->nSize = iVar15;
      local_c0 = (void *)CONCAT44(local_c0._4_4_,iVar15);
    }
    iVar2 = 0;
    pVVar6 = local_70;
    for (iVar3 = 0; iVar3 < pVVar6->nSize; iVar3 = iVar3 + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar6,iVar3);
      if ((*(uint *)&pAVar7->field_0x18 & 7) != 2) {
        __assert_fail("Aig_ObjIsCi(pObjPi)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                      ,0x109,
                      "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
      }
      iVar4 = Saig_ObjIsLo(p,pAVar7);
      if (iVar4 != 0) {
        pvVar10 = (pAVar7->field_5).pData;
        if (pvVar10 == (void *)0x0) {
          __assert_fail("pObjPiCopy != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0x10d,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        iVar4 = Saig_ObjIsLo(p,pAVar7);
        if (iVar4 == 0) {
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        pVVar6 = p->vCos;
        iVar4 = p->nTruePos;
        iVar15 = Aig_ObjCioId(pAVar7);
        Entry = Vec_PtrEntry(pVVar6,(iVar4 + iVar15) - p->nTruePis);
        Vec_PtrPush(local_68,Entry);
        pCVar9 = local_b8;
        pVVar8 = local_c8;
        iVar4 = local_b8->pVarNums[*(int *)((long)pvVar10 + 0x24)];
        if (iVar2 == local_c8->nCap) {
          iVar15 = iVar2 * 2;
          if (iVar2 < 0x10) {
            iVar15 = 0x10;
          }
          Vec_IntGrow(local_c8,iVar15);
          iVar2 = pVVar8->nSize;
        }
        lVar18 = (long)iVar2;
        iVar2 = iVar2 + 1;
        pVVar8->nSize = iVar2;
        pVVar8->pArray[lVar18] = iVar4;
        iVar4 = (pAVar7->field_0).CioId - p->nTruePis;
        if ((iVar4 < 0) || (p->nRegs <= iVar4)) {
          __assert_fail("iReg >= 0 && iReg < Aig_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                        ,0x112,
                        "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                       );
        }
        Vec_IntWriteEntry(local_b0,iVar4 + (int)local_88,
                          pCVar9->pVarNums[*(int *)((long)pvVar10 + 0x24)]);
        pVVar6 = local_70;
        s = local_98;
      }
    }
    iVar2 = (int)local_c0 / p->nRegs;
    if ((int)local_c0 % p->nRegs != 0) {
      __assert_fail("Vec_IntSize(vState)%Aig_ManRegNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                    ,0x116,
                    "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)");
    }
    if (local_78 != 0) {
      uVar13 = iVar2 - 1;
      uVar12 = 1;
      while (iVar3 = (int)uVar12, iVar3 < (int)uVar13) {
        if (fVeryVerbose != 0) {
          printf("Adding constaint for state %2d and state %2d.\n",uVar12,(ulong)uVar13);
        }
        iVar4 = Saig_ManAddUniqueness
                          (s,local_b0,p->nRegs,iVar3,uVar13,&nSatVarNum,(int *)&local_e0,fVerbose);
        uVar12 = (ulong)(iVar3 + 1U);
        if (iVar4 != 0) {
          bVar20 = false;
          uVar12 = (ulong)(((int)local_d0 + iVar3 + 1U) - 1);
          goto LAB_0059308b;
        }
      }
      local_d0 = (ulong)(((int)local_d0 + iVar3) - 1);
    }
    iVar4 = (int)local_60;
    bVar20 = local_f0 == local_a8;
    iVar3 = (int)local_c0;
    if ((int)local_c0 < 1) {
      iVar3 = 0;
    }
    local_c0 = (void *)CONCAT44(local_c0._4_4_,iVar3);
    uVar12 = local_d0 & 0xffffffff;
    do {
      iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,local_40,0,0,0);
      if (fVerbose != 0) {
        uVar16 = (ulong)local_e0;
        iVar15 = 0x853e4d;
        printf("Frame %4d : PI =%5d. PO =%5d. AIG =%5d. Var =%7d. Clau =%7d. Conf =%7d. ",
               (ulong)local_f0,(ulong)(uint)local_a0->nObjs[2],(ulong)(uint)local_a0->nObjs[3]);
        Abc_Print(iVar15,"%s =","Time",uVar16);
        aVar5 = Abc_Clock();
        Abc_Print(iVar15,"%9.2f sec\n",(double)(aVar5 - local_50) / 1000000.0);
      }
      if (iVar3 != 1) {
        pVVar8 = local_c8;
        if (iVar3 == -1) {
          bVar20 = false;
        }
        else {
          if (iVar3 != 0) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0x13c,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          local_a4 = -1;
          bVar20 = true;
        }
        goto LAB_0059308b;
      }
      if (fVeryVerbose != 0) {
        for (iVar3 = 0; (int)local_c0 != iVar3; iVar3 = iVar3 + 1) {
          v = Vec_IntEntry(local_b0,iVar3);
          iVar15 = p->nRegs;
          if ((iVar3 != 0) && (iVar3 % iVar15 == 0)) {
            putchar(10);
            iVar15 = p->nRegs;
          }
          if (iVar3 % iVar15 == 0) {
            printf("       State %3d : ");
          }
          uVar13 = 0x78;
          if (-1 < v) {
            uVar13 = sat_solver_var_value(s,v);
            uVar13 = uVar13 | 0x30;
          }
          putchar(uVar13);
        }
        putchar(10);
      }
      if (bVar20 && iVar4 != 0) {
        local_a4 = -1;
        if (fGetCex == 0) {
          local_f0 = local_a8;
          pVVar8 = local_c8;
        }
        else {
          pAVar11 = Abc_CexAlloc(p->nRegs + -1,p->nTruePis,1);
          pVVar8 = local_c8;
          pAVar11->iPo = 0;
          pAVar11->iFrame = 0;
          uVar13 = 0;
          while (uVar14 = uVar13, uVar13 = uVar14 + 1, (int)uVar13 < local_90->nSize) {
            iVar2 = Vec_IntEntry(local_90,uVar13);
            if ((-1 < iVar2) && (iVar2 = sat_solver_var_value(s,iVar2), iVar2 != 0)) {
              (&pAVar11[1].iPo)[uVar14 >> 5] =
                   (&pAVar11[1].iPo)[uVar14 >> 5] | 1 << ((byte)uVar14 & 0x1f);
            }
          }
          if (pAVar11->nBits != uVar14) {
            __assert_fail("iBit == pCex->nBits",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigInd.c"
                          ,0x15a,
                          "int Saig_ManInduction(Aig_Man_t *, int, int, int, int, int, int, int, int)"
                         );
          }
          Abc_CexFree(p->pSeqModel);
          p->pSeqModel = pAVar11;
          local_f0 = local_a8;
        }
        goto LAB_00593274;
      }
      if (local_7c == 0) {
        uVar12 = local_d0 & 0xffffffff;
        break;
      }
      bVar1 = false;
      uVar16 = 1;
      while (iVar3 = (int)uVar16, iVar3 < iVar2) {
        for (uVar13 = iVar3 + 1U; (int)uVar13 < iVar2; uVar13 = uVar13 + 1) {
          iVar15 = Saig_ManStatesAreEqual(local_98,local_b0,p->nRegs,iVar3,uVar13);
          if (iVar15 != 0) {
            if (fVeryVerbose != 0) {
              printf("Adding constaint for state %2d and state %2d.\n",uVar16,(ulong)uVar13);
            }
            uVar12 = (ulong)((int)uVar12 + 1);
            iVar15 = Saig_ManAddUniqueness
                               (local_98,local_b0,p->nRegs,iVar3,uVar13,&nSatVarNum,(int *)&local_e0
                                ,fVerbose);
            if (iVar15 != 0) {
              bVar20 = false;
              pVVar8 = local_c8;
              s = local_98;
              goto LAB_0059308b;
            }
            bVar1 = true;
          }
        }
        uVar16 = (ulong)(iVar3 + 1U);
      }
      s = local_98;
    } while (bVar1);
    local_f0 = local_f0 + 1;
    pCVar9 = local_b8;
    local_d0 = uVar12;
  } while( true );
LAB_00593274:
  bVar20 = false;
  uVar12 = local_d0;
LAB_0059308b:
  lVar18 = local_48;
  if (fVerbose != 0) {
    if ((local_48 == 0) || (aVar5 = Abc_Clock(), aVar5 < lVar18)) {
      if (bVar20) {
        uVar12 = (ulong)(local_f0 + 1);
        __format = "Conflict limit (%d) was reached during iteration %d.\n";
        uVar16 = (ulong)local_74;
      }
      else {
        uVar16 = (ulong)(local_f0 + 1);
        local_78 = local_78 | local_7c;
        if (local_78 == 0) {
          printf("Completed %d iterations.\n",uVar16);
          goto LAB_00593105;
        }
        __format = "Completed %d iterations and added %d uniqueness constraints.\n";
        uVar12 = uVar12 & 0xffffffff;
      }
    }
    else {
      uVar12 = (ulong)(local_f0 + 1);
      __format = "Timeout (%d sec) was reached during iteration %d.\n";
      uVar16 = (ulong)local_54;
    }
    printf(__format,uVar16,uVar12);
  }
LAB_00593105:
  sat_solver_delete(s);
  Aig_ManStop(local_a0);
  Cnf_DataFree(local_b8);
  Vec_IntFree(pVVar8);
  Vec_PtrFree(local_68);
  Vec_PtrFree(local_70);
  Vec_IntFree(local_b0);
  pVVar8 = local_90;
  if (local_90 != (Vec_Int_t *)0x0) {
    if (local_90->pArray != (int *)0x0) {
      free(local_90->pArray);
      pVVar8->pArray = (int *)0x0;
    }
    free(pVVar8);
  }
  return local_a4;
}

Assistant:

int Saig_ManInduction( Aig_Man_t * p, int nTimeOut, int nFramesMax, int nConfMax, int fUnique, int fUniqueAll, int fGetCex, int fVerbose, int fVeryVerbose )
{
    sat_solver * pSat;
    Aig_Man_t * pAigPart = NULL;
    Cnf_Dat_t * pCnfPart = NULL;
    Vec_Int_t * vTopVarNums, * vState, * vTopVarIds = NULL;
    Vec_Ptr_t * vTop, * vBot;
    Aig_Obj_t * pObjPi, * pObjPiCopy, * pObjPo;
    int i, k, f, Lits[2], status = -1, RetValue, nSatVarNum, nConfPrev;
    int nOldSize, iReg, iLast, fAdded, nConstrs = 0, nClauses = 0;
    abctime clk, nTimeToStop = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    assert( fUnique == 0 || fUniqueAll == 0 );
    assert( Saig_ManPoNum(p) == 1 );
    Aig_ManSetCioIds( p );

    // start the top by including the PO
    vBot = Vec_PtrAlloc( 100 );
    vTop = Vec_PtrAlloc( 100 );
    vState = Vec_IntAlloc( 1000 );
    Vec_PtrPush( vTop, Aig_ManCo(p, 0) );
    // start the array of CNF variables
    vTopVarNums = Vec_IntAlloc( 100 );
    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 1000 );

    // set runtime limit
    if ( nTimeToStop )
        sat_solver_set_runtime_limit( pSat, nTimeToStop );

    // iterate backward unrolling
    RetValue = -1;
    nSatVarNum = 0;
    if ( fVerbose )
        printf( "Induction parameters: FramesMax = %5d. ConflictMax = %6d.\n", nFramesMax, nConfMax );
    for ( f = 0; ; f++ )
    { 
        if ( f > 0 )
        {
            Aig_ManStop( pAigPart );
            Cnf_DataFree( pCnfPart );
        }
        clk = Abc_Clock();
        // get the bottom
        Aig_SupportNodes( p, (Aig_Obj_t **)Vec_PtrArray(vTop), Vec_PtrSize(vTop), vBot );
        // derive AIG for the part between top and bottom
        pAigPart = Aig_ManDupSimpleDfsPart( p, vBot, vTop );
        // convert it into CNF
        pCnfPart = Cnf_Derive( pAigPart, Aig_ManCoNum(pAigPart) );
        Cnf_DataLift( pCnfPart, nSatVarNum );
        nSatVarNum += pCnfPart->nVars;
        nClauses   += pCnfPart->nClauses;

        // remember top frame var IDs
        if ( fGetCex && vTopVarIds == NULL )
        {
            vTopVarIds = Vec_IntStartFull( Aig_ManCiNum(p) );
            Aig_ManForEachCi( p, pObjPi, i )
            {
                if ( pObjPi->pData == NULL )
                    continue;
                pObjPiCopy = (Aig_Obj_t *)pObjPi->pData;
                assert( Aig_ObjIsCi(pObjPiCopy) );
                if ( Saig_ObjIsPi(p, pObjPi) )
                    Vec_IntWriteEntry( vTopVarIds, Aig_ObjCioId(pObjPi) + Saig_ManRegNum(p), pCnfPart->pVarNums[Aig_ObjId(pObjPiCopy)] );
                else if ( Saig_ObjIsLo(p, pObjPi) )
                    Vec_IntWriteEntry( vTopVarIds, Aig_ObjCioId(pObjPi) - Saig_ManPiNum(p), pCnfPart->pVarNums[Aig_ObjId(pObjPiCopy)] );
                else assert( 0 );
            }
        }

        // stitch variables of top and bot
        assert( Aig_ManCoNum(pAigPart)-1 == Vec_IntSize(vTopVarNums) );
        Aig_ManForEachCo( pAigPart, pObjPo, i )
        {
            if ( i == 0 )
            {
                // do not perform inductive strengthening
//                if ( f > 0 )
//                    continue;
                // add topmost literal
                Lits[0] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], f>0 );
                if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
                    assert( 0 );
                nClauses++;
                continue;
            }
            Lits[0] = toLitCond( Vec_IntEntry(vTopVarNums, i-1), 0 );
            Lits[1] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], 1 );
            if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
                assert( 0 );
            Lits[0] = toLitCond( Vec_IntEntry(vTopVarNums, i-1), 1 );
            Lits[1] = toLitCond( pCnfPart->pVarNums[pObjPo->Id], 0 );
            if ( !sat_solver_addclause( pSat, Lits, Lits+2 ) )
                assert( 0 );
            nClauses += 2;
        }
        // add CNF to the SAT solver
        for ( i = 0; i < pCnfPart->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnfPart->pClauses[i], pCnfPart->pClauses[i+1] ) )
                break;
        if ( i < pCnfPart->nClauses )
        {
//            printf( "SAT solver became UNSAT after adding clauses.\n" );
            RetValue = 1;
            break;
        }

        // create new set of POs to derive new top
        Vec_PtrClear( vTop );
        Vec_PtrPush( vTop, Aig_ManCo(p, 0) );
        Vec_IntClear( vTopVarNums );
        nOldSize = Vec_IntSize(vState);
        Vec_IntFillExtra( vState, nOldSize + Aig_ManRegNum(p), -1 );
        Vec_PtrForEachEntry( Aig_Obj_t *, vBot, pObjPi, i )
        {
            assert( Aig_ObjIsCi(pObjPi) );
            if ( Saig_ObjIsLo(p, pObjPi) )
            {
                pObjPiCopy = (Aig_Obj_t *)pObjPi->pData;
                assert( pObjPiCopy != NULL );
                Vec_PtrPush( vTop, Saig_ObjLoToLi(p, pObjPi) );
                Vec_IntPush( vTopVarNums, pCnfPart->pVarNums[pObjPiCopy->Id] );

                iReg = pObjPi->CioId - Saig_ManPiNum(p);
                assert( iReg >= 0 && iReg < Aig_ManRegNum(p) );
                Vec_IntWriteEntry( vState, nOldSize+iReg, pCnfPart->pVarNums[pObjPiCopy->Id] );
            }
        } 
        assert( Vec_IntSize(vState)%Aig_ManRegNum(p) == 0 );
        iLast = Vec_IntSize(vState)/Aig_ManRegNum(p);
        if ( fUniqueAll )
        {
            for ( i = 1; i < iLast-1; i++ )
            {
                nConstrs++;
                if ( fVeryVerbose )
                    printf( "Adding constaint for state %2d and state %2d.\n", i, iLast-1 );
                if ( Saig_ManAddUniqueness( pSat, vState, Aig_ManRegNum(p), i, iLast-1, &nSatVarNum, &nClauses, fVerbose ) )
                    break;
            }
            if ( i < iLast-1 )
            {
                RetValue = 1;
                break;
            }
        }

nextrun:
        fAdded = 0;
        // run the SAT solver
        nConfPrev = pSat->stats.conflicts;
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfMax, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Frame %4d : PI =%5d. PO =%5d. AIG =%5d. Var =%7d. Clau =%7d. Conf =%7d. ",
                f, Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), Aig_ManNodeNum(pAigPart), 
                nSatVarNum, nClauses, (int)pSat->stats.conflicts-nConfPrev );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( status == l_Undef )
            break;
        if ( status == l_False )
        {
            RetValue = 1;
            break;
        }
        assert( status == l_True );
        // the problem is SAT - add more clauses
        if ( fVeryVerbose )
        {
            Vec_IntForEachEntry( vState, iReg, i )
            {
                if ( i && (i % Aig_ManRegNum(p)) == 0 )
                    printf( "\n" );
                if ( (i % Aig_ManRegNum(p)) == 0 )
                    printf( "       State %3d : ", i/Aig_ManRegNum(p) );
                printf( "%c", (iReg >= 0) ? ('0' + sat_solver_var_value(pSat, iReg)) : 'x' );
            }
            printf( "\n" );
        }
        if ( nFramesMax && f == nFramesMax - 1 )
        {
            // derive counter-example
            assert( status == l_True );
            if ( fGetCex )
            {
                int VarNum, iBit = 0;
                Abc_Cex_t * pCex = Abc_CexAlloc( Aig_ManRegNum(p)-1, Saig_ManPiNum(p), 1 );
                pCex->iFrame = 0;
                pCex->iPo = 0;
                Vec_IntForEachEntryStart( vTopVarIds, VarNum, i, 1 )
                {
                    if ( VarNum >= 0 && sat_solver_var_value( pSat, VarNum ) )
                        Abc_InfoSetBit( pCex->pData, iBit );
                    iBit++;
                }
                assert( iBit == pCex->nBits );
                Abc_CexFree( p->pSeqModel );
                p->pSeqModel = pCex;
            }
            break;
        }
        if ( fUnique )
        {
            for ( i = 1; i < iLast; i++ )
            {
                for ( k = i+1; k < iLast; k++ )
                {
                    if ( !Saig_ManStatesAreEqual( pSat, vState, Aig_ManRegNum(p), i, k ) )
                        continue;
                    nConstrs++;
                    fAdded = 1;
                    if ( fVeryVerbose )
                        printf( "Adding constaint for state %2d and state %2d.\n", i, k );
                    if ( Saig_ManAddUniqueness( pSat, vState, Aig_ManRegNum(p), i, k, &nSatVarNum, &nClauses, fVerbose ) )
                        break;
                }
                if ( k < iLast )
                    break;
            }
            if ( i < iLast )
            {
                RetValue = 1;
                break;
            }
        }
        if ( fAdded )
            goto nextrun;
    }
    if ( fVerbose )
    {
        if ( nTimeToStop && Abc_Clock() >= nTimeToStop )
            printf( "Timeout (%d sec) was reached during iteration %d.\n", nTimeOut, f+1 );
        else if ( status == l_Undef )
            printf( "Conflict limit (%d) was reached during iteration %d.\n", nConfMax, f+1 );
        else if ( fUnique || fUniqueAll )
            printf( "Completed %d iterations and added %d uniqueness constraints.\n", f+1, nConstrs );
        else
            printf( "Completed %d iterations.\n", f+1 );
    }
    // cleanup
    sat_solver_delete( pSat );
    Aig_ManStop( pAigPart );
    Cnf_DataFree( pCnfPart );
    Vec_IntFree( vTopVarNums );
    Vec_PtrFree( vTop );
    Vec_PtrFree( vBot );
    Vec_IntFree( vState );
    Vec_IntFreeP( &vTopVarIds );
    return RetValue;
}